

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Hop_Obj_t * Abc_ObjHopFromGia(Hop_Man_t *pHopMan,Gia_Man_t *p,int GiaId,Vec_Ptr_t *vCopies)

{
  int iVar1;
  int *piVar2;
  Hop_Obj_t *pHVar3;
  int local_2c;
  int iFan;
  int k;
  Vec_Ptr_t *vCopies_local;
  int GiaId_local;
  Gia_Man_t *p_local;
  Hop_Man_t *pHopMan_local;
  
  iVar1 = Gia_ObjIsLut(p,GiaId);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut(p, GiaId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2b5,"Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)")
    ;
  }
  iVar1 = Gia_ObjLutSize(p,GiaId);
  if (iVar1 < 1) {
    __assert_fail("Gia_ObjLutSize(p, GiaId) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2b6,"Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)")
    ;
  }
  Gia_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Gia_ObjLutSize(p,GiaId), local_2c < iVar1; local_2c = local_2c + 1) {
    piVar2 = Gia_ObjLutFanins(p,GiaId);
    iVar1 = piVar2[local_2c];
    Gia_ObjSetTravIdCurrentId(p,iVar1);
    pHVar3 = Hop_IthVar(pHopMan,local_2c);
    Vec_PtrWriteEntry(vCopies,iVar1,pHVar3);
  }
  pHVar3 = Abc_ObjHopFromGia_rec(pHopMan,p,GiaId,vCopies);
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia( Hop_Man_t * pHopMan, Gia_Man_t * p, int GiaId, Vec_Ptr_t * vCopies )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, GiaId) );
    assert( Gia_ObjLutSize(p, GiaId) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, GiaId, iFan, k )
    {
        Gia_ObjSetTravIdCurrentId(p, iFan);
        Vec_PtrWriteEntry( vCopies, iFan, Hop_IthVar(pHopMan, k) );
    }
    return Abc_ObjHopFromGia_rec( pHopMan, p, GiaId, vCopies );
}